

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::handleRead(EventLoop *this)

{
  char *pcVar1;
  ssize_t v;
  LogStream *pLVar2;
  char **ppcVar3;
  uint64_t one;
  undefined8 local_ff0;
  Logger local_fe8;
  
  local_ff0 = 1;
  v = readn(this->wakeupFd_,&local_ff0,8);
  if (v != 8) {
    Logger::Logger(&local_fe8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/EventLoop.cpp"
                   ,0x41);
    if (8 < ((int)&local_fe8 + 0xfa8) - (int)local_fe8.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_fe8.impl_.stream_.buffer_.cur_,"EventLoo",8);
      local_fe8.impl_.stream_.buffer_.cur_ = local_fe8.impl_.stream_.buffer_.cur_ + 8;
    }
    pLVar2 = LogStream::operator<<((LogStream *)&local_fe8,v);
    ppcVar3 = &(pLVar2->buffer_).cur_;
    pcVar1 = (pLVar2->buffer_).cur_;
    if (8 < (int)ppcVar3 - (int)pcVar1) {
      builtin_strncpy(pcVar1," bytes i",8);
      *ppcVar3 = *ppcVar3 + 8;
    }
    Logger::~Logger(&local_fe8);
  }
  ((this->pwakeupChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_
       = 0x80000001;
  return;
}

Assistant:

void EventLoop::handleRead(){
    uint64_t one = 1;
    ssize_t n=readn(wakeupFd_, &one, sizeof one);
    if(n!=sizeof one){
        LOG<<"EventLoop::handleRead() reads"<<n<<" bytes instead of 8";
    }
    // pwakeupChannel_->setEvents(EPOLLIN | EPOLLET | EPOLLONESHOT);
    pwakeupChannel_->setEvents(EPOLLIN|EPOLLET);
}